

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRF02.h
# Opt level: O2

int GetRangeSRF02(SRF02 *pSRF02,int device,double *pValue)

{
  int iVar1;
  int iVar2;
  double dVar3;
  uint8 local_68 [32];
  uchar recvbuf [32];
  
  if ((uint)device < 0x10) {
    iVar1 = SetSlaveComputerI2CBus
                      (pSRF02->I2CBus,pSRF02->addr[(uint)device],0,0,pSRF02->nbretries,
                       pSRF02->timeout);
    iVar2 = 1;
    if (iVar1 == 0) {
      local_68[8] = '\0';
      local_68[9] = '\0';
      local_68[10] = '\0';
      local_68[0xb] = '\0';
      local_68[0xc] = '\0';
      local_68[0xd] = '\0';
      local_68[0xe] = '\0';
      local_68[0xf] = '\0';
      local_68[0x10] = '\0';
      local_68[0x11] = '\0';
      local_68[0x12] = '\0';
      local_68[0x13] = '\0';
      local_68[0x14] = '\0';
      local_68[0x15] = '\0';
      local_68[0x16] = '\0';
      local_68[0x17] = '\0';
      local_68[0x18] = '\0';
      local_68[0x19] = '\0';
      local_68[0x1a] = '\0';
      local_68[0x1b] = '\0';
      local_68[0x1c] = '\0';
      local_68[0x1d] = '\0';
      local_68[0x1e] = '\0';
      local_68[0x1f] = '\0';
      local_68[0] = '\0';
      local_68[1] = 'Q';
      local_68[2] = '\0';
      local_68[3] = '\0';
      local_68[4] = '\0';
      local_68[5] = '\0';
      local_68[6] = '\0';
      local_68[7] = '\0';
      iVar1 = WriteAllComputerI2CBus(pSRF02->I2CBus,local_68,2);
      if (iVar1 == 0) {
        if ((pSRF02->bSaveRawData != 0) && ((FILE *)pSRF02->pfSaveFile != (FILE *)0x0)) {
          fwrite(local_68,2,1,(FILE *)pSRF02->pfSaveFile);
          fflush((FILE *)pSRF02->pfSaveFile);
        }
        mSleep((long)pSRF02->RangingDelay);
        local_68[0x10] = '\0';
        local_68[0x11] = '\0';
        local_68[0x12] = '\0';
        local_68[0x13] = '\0';
        local_68[0x14] = '\0';
        local_68[0x15] = '\0';
        local_68[0x16] = '\0';
        local_68[0x17] = '\0';
        local_68[0x18] = '\0';
        local_68[0x19] = '\0';
        local_68[0x1a] = '\0';
        local_68[0x1b] = '\0';
        local_68[0x1c] = '\0';
        local_68[0x1d] = '\0';
        local_68[0x1e] = '\0';
        local_68[0x1f] = '\0';
        local_68[0] = '\0';
        local_68[1] = '\0';
        local_68[2] = '\0';
        local_68[3] = '\0';
        local_68[4] = '\0';
        local_68[5] = '\0';
        local_68[6] = '\0';
        local_68[7] = '\0';
        local_68[8] = '\0';
        local_68[9] = '\0';
        local_68[10] = '\0';
        local_68[0xb] = '\0';
        local_68[0xc] = '\0';
        local_68[0xd] = '\0';
        local_68[0xe] = '\0';
        local_68[0xf] = '\0';
        iVar2 = 1;
        iVar1 = WriteAllComputerI2CBus(pSRF02->I2CBus,local_68,1);
        if (iVar1 == 0) {
          if ((pSRF02->bSaveRawData != 0) && ((FILE *)pSRF02->pfSaveFile != (FILE *)0x0)) {
            fputc((int)(char)local_68[0],(FILE *)pSRF02->pfSaveFile);
            fflush((FILE *)pSRF02->pfSaveFile);
          }
          recvbuf[0x10] = '\0';
          recvbuf[0x11] = '\0';
          recvbuf[0x12] = '\0';
          recvbuf[0x13] = '\0';
          recvbuf[0x14] = '\0';
          recvbuf[0x15] = '\0';
          recvbuf[0x16] = '\0';
          recvbuf[0x17] = '\0';
          recvbuf[0x18] = '\0';
          recvbuf[0x19] = '\0';
          recvbuf[0x1a] = '\0';
          recvbuf[0x1b] = '\0';
          recvbuf[0x1c] = '\0';
          recvbuf[0x1d] = '\0';
          recvbuf[0x1e] = '\0';
          recvbuf[0x1f] = '\0';
          recvbuf[0] = '\0';
          recvbuf[1] = '\0';
          recvbuf[2] = '\0';
          recvbuf[3] = '\0';
          recvbuf[4] = '\0';
          recvbuf[5] = '\0';
          recvbuf[6] = '\0';
          recvbuf[7] = '\0';
          recvbuf[8] = '\0';
          recvbuf[9] = '\0';
          recvbuf[10] = '\0';
          recvbuf[0xb] = '\0';
          recvbuf[0xc] = '\0';
          recvbuf[0xd] = '\0';
          recvbuf[0xe] = '\0';
          recvbuf[0xf] = '\0';
          iVar1 = ReadAllComputerI2CBus(pSRF02->I2CBus,recvbuf,6);
          if (iVar1 == 0) {
            if ((pSRF02->bSaveRawData != 0) && ((FILE *)pSRF02->pfSaveFile != (FILE *)0x0)) {
              fwrite(recvbuf,6,1,(FILE *)pSRF02->pfSaveFile);
              fflush((FILE *)pSRF02->pfSaveFile);
            }
            dVar3 = (double)(ushort)(recvbuf._2_2_ << 8 | (ushort)recvbuf._2_2_ >> 8) / 100.0;
            *pValue = dVar3;
            pSRF02->LastRanges[(uint)device] = dVar3;
            iVar2 = 0;
          }
        }
      }
    }
  }
  else {
    puts("Error reading data from a SRF02 : Invalid parameter. ");
    iVar2 = 3;
  }
  return iVar2;
}

Assistant:

inline int GetRangeSRF02(SRF02* pSRF02, int device, double* pValue)
{
	unsigned char sendbuf[MAX_NB_BYTES_SRF02];
	unsigned char recvbuf[MAX_NB_BYTES_SRF02];
	int sendbuflen = 0;
	int recvbuflen = 0;

	if ((device < 0)||(device >= MAX_NB_DEVICES_SRF02))
	{
		printf("Error reading data from a SRF02 : Invalid parameter. \n");
		return EXIT_INVALID_PARAMETER;
	}

	if (SetSlaveComputerI2CBus(pSRF02->I2CBus, pSRF02->addr[device], 0, 0, pSRF02->nbretries, pSRF02->timeout) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sendbuf[0] = (unsigned char)COMMAND_REG_SRF02;
	sendbuf[1] = (unsigned char)REAL_RNG_CM_CMD_SRF02;
	sendbuflen = 2;

	if (WriteAllComputerI2CBus(pSRF02->I2CBus, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pSRF02->bSaveRawData)&&(pSRF02->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pSRF02->pfSaveFile);
		fflush(pSRF02->pfSaveFile);
	}

	mSleep(pSRF02->RangingDelay);

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sendbuf[0] = (unsigned char)COMMAND_REG_SRF02;
	sendbuflen = 1;

	if (WriteAllComputerI2CBus(pSRF02->I2CBus, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pSRF02->bSaveRawData)&&(pSRF02->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pSRF02->pfSaveFile);
		fflush(pSRF02->pfSaveFile);
	}

	// Prepare the buffer that should receive data from device.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 6;

	if (ReadAllComputerI2CBus(pSRF02->I2CBus, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pSRF02->bSaveRawData)&&(pSRF02->pfSaveFile))
	{
		fwrite(recvbuf, recvbuflen, 1, pSRF02->pfSaveFile);
		fflush(pSRF02->pfSaveFile);
	}

	// Display and analyze received data.
	//printf("Received : \"%s\"\n", recvbuf);
	*pValue = (recvbuf[3] + 256*recvbuf[2])/100.0; // Convert in m.

	pSRF02->LastRanges[device] = *pValue;

	return EXIT_SUCCESS;
}